

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
* __thiscall
cmGeneratorTarget::GetIncludeDirectories
          (vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *__return_storage_ptr__,cmGeneratorTarget *this,string *config,string *lang)

{
  bool bVar1;
  cmMakefile *pcVar2;
  pointer pcVar3;
  cmLinkImplItem *this_00;
  cmGeneratorTarget *pcVar4;
  string *psVar5;
  cmLocalGenerator *pcVar6;
  pointer this_01;
  bool *pbVar7;
  bool bVar8;
  bool bVar9;
  int iVar10;
  PolicyStatus PVar11;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var12;
  cmValue __args;
  cmLinkImplementationLibraries *pcVar13;
  string *psVar14;
  string *psVar15;
  ostream *poVar16;
  string *psVar17;
  long *plVar18;
  cmake *this_02;
  size_type *psVar19;
  long *plVar20;
  PolicyID id;
  PolicyID id_00;
  pointer this_03;
  pointer pEVar21;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_04;
  MessageType MVar22;
  bool bVar23;
  pair<std::__detail::_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>,_bool>
  pVar24;
  string_view value;
  string local_390;
  string propertyName;
  long *local_338;
  long local_330;
  long local_328 [2];
  pointer local_318;
  PolicyMap *local_310;
  cmListFileBacktrace *local_308;
  EvaluatedTargetPropertyEntries entries;
  long local_2e0;
  long *local_2d8;
  long local_2d0;
  long local_2c8;
  long lStack_2c0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  debugProperties;
  string obj_dir;
  ios_base local_230 [264];
  cmConstStack<cmListFileContext,_cmListFileBacktrace> local_128;
  pointer local_110;
  string local_108;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  uniqueIncludes;
  cmGeneratorExpressionDAGChecker dagChecker;
  
  (__return_storage_ptr__->
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uniqueIncludes._M_h._M_buckets = &uniqueIncludes._M_h._M_single_bucket;
  uniqueIncludes._M_h._M_bucket_count = 1;
  uniqueIncludes._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  uniqueIncludes._M_h._M_element_count = 0;
  uniqueIncludes._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  uniqueIncludes._M_h._M_rehash_policy._M_next_resize = 0;
  uniqueIncludes._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"INCLUDE_DIRECTORIES","");
  cmGeneratorExpressionDAGChecker::cmGeneratorExpressionDAGChecker
            (&dagChecker,this,&local_108,(GeneratorExpressionContent *)0x0,
             (cmGeneratorExpressionDAGChecker *)0x0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
  }
  debugProperties.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  debugProperties.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  debugProperties.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pcVar2 = this->Makefile;
  obj_dir._M_dataplus._M_p = (pointer)&obj_dir.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&obj_dir,"CMAKE_DEBUG_TARGET_PROPERTIES","");
  cmMakefile::GetDefExpandList(pcVar2,&obj_dir,&debugProperties,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)obj_dir._M_dataplus._M_p != &obj_dir.field_2) {
    operator_delete(obj_dir._M_dataplus._M_p,obj_dir.field_2._M_allocated_capacity + 1);
  }
  if (this->DebugIncludesDone == false) {
    _Var12 = std::
             __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<char_const[20]>>
                       (debugProperties.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        debugProperties.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish,"INCLUDE_DIRECTORIES");
    bVar23 = _Var12._M_current !=
             debugProperties.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  }
  else {
    bVar23 = false;
  }
  if (this->GlobalGenerator->ConfigureDoneCMP0026AndCMP0024 == true) {
    this->DebugIncludesDone = true;
  }
  anon_unknown.dwarf_161f4de::EvaluateTargetPropertyEntries
            (&entries,this,config,lang,&dagChecker,&this->IncludeDirectoriesEntries);
  iVar10 = std::__cxx11::string::compare((char *)lang);
  if (iVar10 == 0) {
    obj_dir._M_dataplus._M_p = (pointer)&obj_dir.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&obj_dir,"Swift_MODULE_DIRECTORY","");
    anon_unknown.dwarf_161f4de::AddLangSpecificImplicitIncludeDirectories
              (this,lang,config,&obj_dir,BINARY,&entries);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)obj_dir._M_dataplus._M_p != &obj_dir.field_2) {
      operator_delete(obj_dir._M_dataplus._M_p,obj_dir.field_2._M_allocated_capacity + 1);
    }
  }
  bVar8 = cmTarget::CanCompileSources(this->Target);
  if (((bVar8) && (iVar10 = std::__cxx11::string::compare((char *)lang), iVar10 != 0)) &&
     (iVar10 = std::__cxx11::string::compare((char *)lang), iVar10 != 0)) {
    propertyName._M_dataplus._M_p = (pointer)&propertyName.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&propertyName,"ISPC_HEADER_DIRECTORY","");
    GetAllConfigCompileLanguages_abi_cxx11_
              ((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&obj_dir,this);
    bVar8 = ::cm::
            contains<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_char[5],_0>
                      ((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&obj_dir,(char (*) [5])"ISPC");
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&obj_dir);
    if (bVar8) {
      __args = GetProperty(this,&propertyName);
      if (__args.Value == (string *)0x0) {
        (*this->GlobalGenerator->_vptr_cmGlobalGenerator[0x16])
                  (&obj_dir,this->GlobalGenerator,&this->ObjectDirectory,config);
        std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
        emplace_back<std::__cxx11::string>
                  ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)
                   __return_storage_ptr__,&obj_dir);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)obj_dir._M_dataplus._M_p != &obj_dir.field_2) {
          operator_delete(obj_dir._M_dataplus._M_p,obj_dir.field_2._M_allocated_capacity + 1);
        }
      }
      else {
        std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
        emplace_back<std::__cxx11::string_const&>
                  ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)
                   __return_storage_ptr__,__args.Value);
      }
    }
    obj_dir._M_dataplus._M_p = (pointer)&obj_dir.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&obj_dir,"ISPC","");
    anon_unknown.dwarf_161f4de::AddLangSpecificImplicitIncludeDirectories
              (this,&obj_dir,config,&propertyName,OBJECT,&entries);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)obj_dir._M_dataplus._M_p != &obj_dir.field_2) {
      operator_delete(obj_dir._M_dataplus._M_p,obj_dir.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)propertyName._M_dataplus._M_p != &propertyName.field_2) {
      operator_delete(propertyName._M_dataplus._M_p,
                      CONCAT71(propertyName.field_2._M_allocated_capacity._1_7_,
                               propertyName.field_2._M_local_buf[0]) + 1);
    }
  }
  obj_dir._M_dataplus._M_p = (pointer)&obj_dir.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&obj_dir,"INTERFACE_INCLUDE_DIRECTORIES","");
  anon_unknown.dwarf_161f4de::AddInterfaceEntries
            (this,config,&obj_dir,lang,&dagChecker,&entries,Yes,Usage);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)obj_dir._M_dataplus._M_p != &obj_dir.field_2) {
    operator_delete(obj_dir._M_dataplus._M_p,obj_dir.field_2._M_allocated_capacity + 1);
  }
  pcVar2 = this->Makefile;
  obj_dir._M_dataplus._M_p = (pointer)&obj_dir.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&obj_dir,"APPLE","");
  bVar8 = cmMakefile::IsOn(pcVar2,&obj_dir);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)obj_dir._M_dataplus._M_p != &obj_dir.field_2) {
    operator_delete(obj_dir._M_dataplus._M_p,obj_dir.field_2._M_allocated_capacity + 1);
  }
  if ((bVar8) &&
     (pcVar13 = GetLinkImplementationLibrariesInternal(this,config,this,Usage),
     pcVar13 != (cmLinkImplementationLibraries *)0x0)) {
    this_03 = (pcVar13->Libraries).
              super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>._M_impl.
              super__Vector_impl_data._M_start;
    pcVar3 = (pcVar13->Libraries).
             super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (this_03 != pcVar3) {
      do {
        psVar14 = cmLinkItem::AsStr_abi_cxx11_(&this_03->super_cmLinkItem);
        psVar15 = cmMakefile::GetHomeOutputDirectory_abi_cxx11_(this->Makefile);
        cmsys::SystemTools::CollapseFullPath(&propertyName,psVar14,psVar15);
        if ((GetIncludeDirectories(std::__cxx11::string_const&,std::__cxx11::string_const&)::
             frameworkCheck == '\0') &&
           (iVar10 = __cxa_guard_acquire(&GetIncludeDirectories(std::__cxx11::string_const&,std::__cxx11::string_const&)
                                          ::frameworkCheck), iVar10 != 0)) {
          GetIncludeDirectories::frameworkCheck.regmust = (char *)0x0;
          GetIncludeDirectories::frameworkCheck.program = (char *)0x0;
          GetIncludeDirectories::frameworkCheck.progsize = 0;
          memset(&GetIncludeDirectories::frameworkCheck,0,0xaa);
          cmsys::RegularExpression::compile
                    (&GetIncludeDirectories::frameworkCheck,
                     "(.*\\.framework)(/Versions/[^/]+)?/[^/]+$");
          __cxa_atexit(cmsys::RegularExpression::~RegularExpression,
                       &GetIncludeDirectories::frameworkCheck,&__dso_handle);
          __cxa_guard_release(&GetIncludeDirectories(std::__cxx11::string_const&,std::__cxx11::string_const&)
                               ::frameworkCheck);
        }
        bVar8 = cmsys::RegularExpression::find
                          (&GetIncludeDirectories::frameworkCheck,propertyName._M_dataplus._M_p,
                           &GetIncludeDirectories::frameworkCheck.regmatch);
        if (bVar8) {
          if (GetIncludeDirectories::frameworkCheck.regmatch.startp[1] == (char *)0x0) {
            obj_dir._M_dataplus._M_p = (pointer)&obj_dir.field_2;
            obj_dir._M_string_length = 0;
            obj_dir.field_2._M_allocated_capacity =
                 obj_dir.field_2._M_allocated_capacity & 0xffffffffffffff00;
          }
          else {
            obj_dir._M_dataplus._M_p = (pointer)&obj_dir.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&obj_dir,GetIncludeDirectories::frameworkCheck.regmatch.startp[1],
                       GetIncludeDirectories::frameworkCheck.regmatch.endp[1]);
          }
          std::__cxx11::string::operator=((string *)&propertyName,(string *)&obj_dir);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)obj_dir._M_dataplus._M_p != &obj_dir.field_2) {
            operator_delete(obj_dir._M_dataplus._M_p,obj_dir.field_2._M_allocated_capacity + 1);
          }
          local_128.TopEntry.
          super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)0x0;
          local_128.TopEntry.
          super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          cmConstStack<cmListFileContext,_cmListFileBacktrace>::cmConstStack(&local_128);
          obj_dir._M_string_length =
               (size_type)
               local_128.TopEntry.
               super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
          obj_dir.field_2._M_allocated_capacity =
               (size_type)
               local_128.TopEntry.
               super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi;
          local_128.TopEntry.
          super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)0x0;
          local_128.TopEntry.
          super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          obj_dir.field_2._8_8_ = 0;
          obj_dir._M_dataplus._M_p = (pointer)this_03;
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     (obj_dir.field_2._M_local_buf + 8),&propertyName);
          std::
          vector<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
          ::emplace_back<(anonymous_namespace)::EvaluatedTargetPropertyEntry>
                    (&entries.Entries,(EvaluatedTargetPropertyEntry *)&obj_dir);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)(obj_dir.field_2._M_local_buf + 8));
          if (obj_dir.field_2._M_allocated_capacity != 0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       obj_dir.field_2._M_allocated_capacity);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)propertyName._M_dataplus._M_p != &propertyName.field_2) {
          operator_delete(propertyName._M_dataplus._M_p,
                          CONCAT71(propertyName.field_2._M_allocated_capacity._1_7_,
                                   propertyName.field_2._M_local_buf[0]) + 1);
        }
        this_03 = this_03 + 1;
      } while (this_03 != pcVar3);
    }
  }
  local_110 = entries.Entries.
              super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  if (entries.Entries.
      super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      entries.Entries.
      super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_310 = &this->PolicyMap;
    pEVar21 = entries.Entries.
              super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      this_00 = pEVar21->LinkImplItem;
      psVar14 = cmLinkItem::AsStr_abi_cxx11_(&this_00->super_cmLinkItem);
      pcVar4 = (this_00->super_cmLinkItem).Target;
      if (pcVar4 == (cmGeneratorTarget *)0x0) {
        bVar8 = false;
      }
      else {
        bVar8 = cmTarget::IsImported(pcVar4->Target);
      }
      bVar1 = this_00->CheckCMP0027;
      propertyName._M_dataplus._M_p = (pointer)&propertyName.field_2;
      propertyName._M_string_length = 0;
      propertyName.field_2._M_local_buf[0] = '\0';
      psVar15 = (pEVar21->Values).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      psVar5 = (pEVar21->Values).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      local_318 = pEVar21;
      if (psVar15 != psVar5) {
        local_308 = &pEVar21->Backtrace;
        do {
          if ((bVar8 != false) && (bVar9 = cmsys::SystemTools::FileExists(psVar15), !bVar9)) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&obj_dir);
            MVar22 = FATAL_ERROR;
            if (bVar1 != false) {
              PVar11 = cmPolicies::PolicyMap::Get(local_310,CMP0027);
              if (PVar11 != OLD) {
                if (PVar11 != WARN) goto LAB_003d52a7;
                cmPolicies::GetPolicyWarning_abi_cxx11_(&local_390,(cmPolicies *)0x1b,id_00);
                poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&obj_dir,local_390._M_dataplus._M_p,
                                     local_390._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\n",1);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_390._M_dataplus._M_p != &local_390.field_2) {
                  operator_delete(local_390._M_dataplus._M_p,
                                  local_390.field_2._M_allocated_capacity + 1);
                }
              }
              MVar22 = AUTHOR_WARNING;
            }
LAB_003d52a7:
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&obj_dir,"Imported target \"",0x11);
            poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&obj_dir,(psVar14->_M_dataplus)._M_p,
                                 psVar14->_M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar16,"\" includes non-existent path\n  \"",0x20);
            poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar16,(psVar15->_M_dataplus)._M_p,psVar15->_M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar16,
                       "\"\nin its INTERFACE_INCLUDE_DIRECTORIES. Possible reasons include:\n* The path was deleted, renamed, or moved to another location.\n* An install or uninstall procedure did not complete successfully.\n* The installation package was faulty and references files it does not provide.\n"
                       ,0x114);
            pcVar6 = this->LocalGenerator;
            std::__cxx11::stringbuf::str();
            cmLocalGenerator::IssueMessage(pcVar6,MVar22,&local_390);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_390._M_dataplus._M_p != &local_390.field_2) {
              operator_delete(local_390._M_dataplus._M_p,local_390.field_2._M_allocated_capacity + 1
                             );
            }
LAB_003d535b:
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&obj_dir);
            std::ios_base::~ios_base(local_230);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)propertyName._M_dataplus._M_p != &propertyName.field_2) {
              operator_delete(propertyName._M_dataplus._M_p,
                              CONCAT71(propertyName.field_2._M_allocated_capacity._1_7_,
                                       propertyName.field_2._M_local_buf[0]) + 1);
            }
            goto LAB_003d5398;
          }
          bVar9 = cmsys::SystemTools::FileIsFullPath(psVar15);
          if (!bVar9) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&obj_dir);
            if (psVar14->_M_string_length == 0) {
              PVar11 = cmPolicies::PolicyMap::Get(local_310,CMP0021);
              MVar22 = FATAL_ERROR;
              if (PVar11 == OLD) {
                bVar9 = true;
              }
              else {
                if (PVar11 == WARN) {
                  cmPolicies::GetPolicyWarning_abi_cxx11_(&local_390,(cmPolicies *)0x15,id);
                  poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)&obj_dir,local_390._M_dataplus._M_p,
                                       local_390._M_string_length);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\n",1);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_390._M_dataplus._M_p != &local_390.field_2) {
                    operator_delete(local_390._M_dataplus._M_p,
                                    local_390.field_2._M_allocated_capacity + 1);
                  }
                  MVar22 = AUTHOR_WARNING;
                }
                bVar9 = false;
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&obj_dir,
                         "Found relative path while evaluating include directories of \"",0x3d);
              psVar17 = cmTarget::GetName_abi_cxx11_(this->Target);
              poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&obj_dir,(psVar17->_M_dataplus)._M_p,
                                   psVar17->_M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\":\n  \"",6);
              poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar16,(psVar15->_M_dataplus)._M_p,psVar15->_M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\"\n",2);
              if (!bVar9) goto LAB_003d4de3;
            }
            else {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&obj_dir,"Target \"",8);
              poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&obj_dir,(psVar14->_M_dataplus)._M_p,
                                   psVar14->_M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar16,
                         "\" contains relative path in its INTERFACE_INCLUDE_DIRECTORIES:\n  \"",
                         0x42);
              poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar16,(psVar15->_M_dataplus)._M_p,psVar15->_M_string_length);
              MVar22 = FATAL_ERROR;
              std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\"",1);
LAB_003d4de3:
              pcVar6 = this->LocalGenerator;
              std::__cxx11::stringbuf::str();
              cmLocalGenerator::IssueMessage(pcVar6,MVar22,&local_390);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_390._M_dataplus._M_p != &local_390.field_2) {
                operator_delete(local_390._M_dataplus._M_p,
                                local_390.field_2._M_allocated_capacity + 1);
              }
              if (MVar22 == FATAL_ERROR) goto LAB_003d535b;
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&obj_dir);
            std::ios_base::~ios_base(local_230);
          }
          value._M_str = (psVar15->_M_dataplus)._M_p;
          value._M_len = psVar15->_M_string_length;
          bVar9 = cmValue::IsOff(value);
          if (!bVar9) {
            cmsys::SystemTools::ConvertToUnixSlashes(psVar15);
          }
          obj_dir._M_dataplus._M_p = (pointer)&uniqueIncludes;
          pVar24 = std::
                   _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                   ::
                   _M_insert<std::__cxx11::string_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
                             ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                               *)obj_dir._M_dataplus._M_p,psVar15,&obj_dir);
          if ((((undefined1  [16])pVar24 & (undefined1  [16])0x1) != (undefined1  [16])0x0) &&
             (std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
              emplace_back<std::__cxx11::string&,cmListFileBacktrace&>
                        ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>
                          *)__return_storage_ptr__,psVar15,local_308), bVar23)) {
            std::operator+(&local_390," * ",psVar15);
            plVar18 = (long *)std::__cxx11::string::append((char *)&local_390);
            obj_dir._M_dataplus._M_p = (pointer)&obj_dir.field_2;
            psVar19 = (size_type *)(plVar18 + 2);
            if ((size_type *)*plVar18 == psVar19) {
              obj_dir.field_2._M_allocated_capacity = *psVar19;
              obj_dir.field_2._8_8_ = plVar18[3];
            }
            else {
              obj_dir.field_2._M_allocated_capacity = *psVar19;
              obj_dir._M_dataplus._M_p = (pointer)*plVar18;
            }
            obj_dir._M_string_length = plVar18[1];
            *plVar18 = (long)psVar19;
            plVar18[1] = 0;
            *(undefined1 *)(plVar18 + 2) = 0;
            std::__cxx11::string::_M_append((char *)&propertyName,(ulong)obj_dir._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)obj_dir._M_dataplus._M_p != &obj_dir.field_2) {
              operator_delete(obj_dir._M_dataplus._M_p,obj_dir.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_390._M_dataplus._M_p != &local_390.field_2) {
              operator_delete(local_390._M_dataplus._M_p,local_390.field_2._M_allocated_capacity + 1
                             );
            }
          }
          psVar15 = psVar15 + 1;
        } while (psVar15 != psVar5);
        if (propertyName._M_string_length != 0) {
          this_02 = cmLocalGenerator::GetCMakeInstance(this->LocalGenerator);
          local_338 = local_328;
          local_2e0 = 0x19;
          local_338 = (long *)std::__cxx11::string::_M_create((ulong *)&local_338,(ulong)&local_2e0)
          ;
          local_328[0] = local_2e0;
          builtin_strncpy((char *)((long)local_338 + 9),"udes for",8);
          builtin_strncpy((char *)((long)local_338 + 0x11)," target ",8);
          *local_338 = 0x636e692064657355;
          local_338[1] = 0x6f6620736564756c;
          local_330 = local_2e0;
          *(char *)((long)local_338 + local_2e0) = '\0';
          psVar14 = cmTarget::GetName_abi_cxx11_(this->Target);
          plVar18 = (long *)std::__cxx11::string::_M_append
                                      ((char *)&local_338,(ulong)(psVar14->_M_dataplus)._M_p);
          plVar20 = plVar18 + 2;
          if ((long *)*plVar18 == plVar20) {
            local_2c8 = *plVar20;
            lStack_2c0 = plVar18[3];
            local_2d8 = &local_2c8;
          }
          else {
            local_2c8 = *plVar20;
            local_2d8 = (long *)*plVar18;
          }
          local_2d0 = plVar18[1];
          *plVar18 = (long)plVar20;
          plVar18[1] = 0;
          *(undefined1 *)(plVar18 + 2) = 0;
          plVar18 = (long *)std::__cxx11::string::append((char *)&local_2d8);
          local_390._M_dataplus._M_p = (pointer)&local_390.field_2;
          psVar19 = (size_type *)(plVar18 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar18 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar19) {
            local_390.field_2._M_allocated_capacity = *psVar19;
            local_390.field_2._8_8_ = plVar18[3];
          }
          else {
            local_390.field_2._M_allocated_capacity = *psVar19;
            local_390._M_dataplus._M_p = (pointer)*plVar18;
          }
          local_390._M_string_length = plVar18[1];
          *plVar18 = (long)psVar19;
          plVar18[1] = 0;
          *(undefined1 *)(plVar18 + 2) = 0;
          plVar18 = (long *)std::__cxx11::string::_M_append
                                      ((char *)&local_390,(ulong)propertyName._M_dataplus._M_p);
          psVar19 = (size_type *)(plVar18 + 2);
          if ((size_type *)*plVar18 == psVar19) {
            obj_dir.field_2._M_allocated_capacity = *psVar19;
            obj_dir.field_2._8_8_ = plVar18[3];
            obj_dir._M_dataplus._M_p = (pointer)&obj_dir.field_2;
          }
          else {
            obj_dir.field_2._M_allocated_capacity = *psVar19;
            obj_dir._M_dataplus._M_p = (pointer)*plVar18;
          }
          obj_dir._M_string_length = plVar18[1];
          *plVar18 = (long)psVar19;
          plVar18[1] = 0;
          *(undefined1 *)(plVar18 + 2) = 0;
          cmake::IssueMessage(this_02,LOG,&obj_dir,local_308);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)obj_dir._M_dataplus._M_p != &obj_dir.field_2) {
            operator_delete(obj_dir._M_dataplus._M_p,obj_dir.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_390._M_dataplus._M_p != &local_390.field_2) {
            operator_delete(local_390._M_dataplus._M_p,local_390.field_2._M_allocated_capacity + 1);
          }
          if (local_2d8 != &local_2c8) {
            operator_delete(local_2d8,local_2c8 + 1);
          }
          if (local_338 != local_328) {
            operator_delete(local_338,local_328[0] + 1);
          }
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)propertyName._M_dataplus._M_p != &propertyName.field_2) {
        operator_delete(propertyName._M_dataplus._M_p,
                        CONCAT71(propertyName.field_2._M_allocated_capacity._1_7_,
                                 propertyName.field_2._M_local_buf[0]) + 1);
      }
      pEVar21 = local_318 + 1;
    } while (pEVar21 != local_110);
  }
LAB_003d5398:
  if (entries.Entries.
      super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      entries.Entries.
      super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    this_04 = &(entries.Entries.
                super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
                ._M_impl.super__Vector_impl_data._M_start)->Values;
    do {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(this_04);
      this_01 = (pointer)(((EvaluatedTargetPropertyEntry *)(this_04 + -1))->Backtrace).
                         super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                         super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi;
      if (this_01 != (pointer)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01);
      }
      pbVar7 = (bool *)(this_04 + 1);
      this_04 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&this_04[2].
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
    } while ((pointer)(pbVar7 + 8) !=
             entries.Entries.
             super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  if (entries.Entries.
      super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(entries.Entries.
                    super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)entries.Entries.
                          super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)entries.Entries.
                          super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&debugProperties);
  if (dagChecker.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (dagChecker.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
               TopEntry.
               super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  std::
  _Rb_tree<const_cmGeneratorTarget_*,_std::pair<const_cmGeneratorTarget_*const,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_cmGeneratorTarget_*const,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  ::~_Rb_tree(&dagChecker.Seen._M_t);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)dagChecker.Property._M_dataplus._M_p != &dagChecker.Property.field_2) {
    operator_delete(dagChecker.Property._M_dataplus._M_p,
                    dagChecker.Property.field_2._M_allocated_capacity + 1);
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&uniqueIncludes._M_h);
  return __return_storage_ptr__;
}

Assistant:

std::vector<BT<std::string>> cmGeneratorTarget::GetIncludeDirectories(
  const std::string& config, const std::string& lang) const
{
  std::vector<BT<std::string>> includes;
  std::unordered_set<std::string> uniqueIncludes;

  cmGeneratorExpressionDAGChecker dagChecker(this, "INCLUDE_DIRECTORIES",
                                             nullptr, nullptr);

  std::vector<std::string> debugProperties;
  this->Makefile->GetDefExpandList("CMAKE_DEBUG_TARGET_PROPERTIES",
                                   debugProperties);

  bool debugIncludes = !this->DebugIncludesDone &&
    cm::contains(debugProperties, "INCLUDE_DIRECTORIES");

  if (this->GlobalGenerator->GetConfigureDoneCMP0026()) {
    this->DebugIncludesDone = true;
  }

  EvaluatedTargetPropertyEntries entries = EvaluateTargetPropertyEntries(
    this, config, lang, &dagChecker, this->IncludeDirectoriesEntries);

  if (lang == "Swift") {
    AddLangSpecificImplicitIncludeDirectories(
      this, lang, config, "Swift_MODULE_DIRECTORY",
      IncludeDirectoryFallBack::BINARY, entries);
  }

  if (this->CanCompileSources() && (lang != "Swift" && lang != "Fortran")) {

    const std::string propertyName = "ISPC_HEADER_DIRECTORY";

    // If this target has ISPC sources make sure to add the header
    // directory to other compilation units
    if (cm::contains(this->GetAllConfigCompileLanguages(), "ISPC")) {
      if (cmValue val = this->GetProperty(propertyName)) {
        includes.emplace_back(*val);
      } else {
        includes.emplace_back(this->GetObjectDirectory(config));
      }
    }

    AddLangSpecificImplicitIncludeDirectories(
      this, "ISPC", config, propertyName, IncludeDirectoryFallBack::OBJECT,
      entries);
  }

  AddInterfaceEntries(this, config, "INTERFACE_INCLUDE_DIRECTORIES", lang,
                      &dagChecker, entries, IncludeRuntimeInterface::Yes);

  if (this->Makefile->IsOn("APPLE")) {
    if (cmLinkImplementationLibraries const* impl =
          this->GetLinkImplementationLibraries(config,
                                               LinkInterfaceFor::Usage)) {
      for (cmLinkImplItem const& lib : impl->Libraries) {
        std::string libDir = cmSystemTools::CollapseFullPath(
          lib.AsStr(), this->Makefile->GetHomeOutputDirectory());

        static cmsys::RegularExpression frameworkCheck(
          "(.*\\.framework)(/Versions/[^/]+)?/[^/]+$");
        if (!frameworkCheck.find(libDir)) {
          continue;
        }

        libDir = frameworkCheck.match(1);

        EvaluatedTargetPropertyEntry ee(lib, cmListFileBacktrace());
        ee.Values.emplace_back(std::move(libDir));
        entries.Entries.emplace_back(std::move(ee));
      }
    }
  }

  processIncludeDirectories(this, entries, includes, uniqueIncludes,
                            debugIncludes);

  return includes;
}